

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeLinkInterface
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget)

{
  _Base_ptr *pp_Var1;
  TargetType TVar2;
  pointer pcVar3;
  pointer pcVar4;
  cmGeneratorTarget *pcVar5;
  PolicyStatus PVar6;
  cmLinkImplementation *pcVar7;
  cmLinkImplementationLibraries *pcVar8;
  char *pcVar9;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range3;
  cmLinkItem *lib;
  pointer __v;
  pointer __v_00;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar10;
  string propName;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> emitted;
  size_type __dnew;
  size_type __dnew_1;
  string local_a8;
  _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
  local_88;
  string local_58;
  size_type local_38;
  
  if (iface->ExplicitLibraries == (char *)0x0) {
    PVar6 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0022);
    if ((PVar6 == WARN) ||
       (PVar6 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0022), PVar6 == OLD)) {
      pcVar8 = GetLinkImplementationLibrariesInternal(this,config,headTarget);
      (iface->super_cmLinkInterface).ImplementationIsInterface = true;
      std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::operator=
                (&(iface->super_cmLinkInterface).WrongConfigLibraries,&pcVar8->WrongConfigLibraries)
      ;
    }
  }
  else {
    TVar2 = this->Target->TargetTypeValue;
    if ((TVar2 < UNKNOWN_LIBRARY) && ((0x86U >> (TVar2 & 0x1f) & 1) != 0)) {
      local_88._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_88._M_impl.super__Rb_tree_header._M_header;
      local_88._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_88._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
      __v = (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
            super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_start;
      pcVar3 = (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
               super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_88._M_impl.super__Rb_tree_header._M_header._M_right =
           local_88._M_impl.super__Rb_tree_header._M_header._M_left;
      if (__v != pcVar3) {
        do {
          std::
          _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
          ::_M_insert_unique<cmLinkItem_const&>
                    ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                      *)&local_88,__v);
          __v = __v + 1;
        } while (__v != pcVar3);
      }
      if (this->Target->TargetTypeValue != INTERFACE_LIBRARY) {
        pcVar7 = GetLinkImplementation(this,config);
        __v_00 = (pcVar7->super_cmLinkImplementationLibraries).Libraries.
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar4 = (pcVar7->super_cmLinkImplementationLibraries).Libraries.
                 super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (__v_00 != pcVar4) {
          do {
            pVar10 = std::
                     _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                     ::_M_insert_unique<cmLinkItem_const&>
                               ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                                 *)&local_88,&__v_00->super_cmLinkItem);
            if (((((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
                (pcVar5 = (__v_00->super_cmLinkItem).Target, pcVar5 != (cmGeneratorTarget *)0x0)) &&
               (pcVar5->Target->TargetTypeValue == SHARED_LIBRARY)) {
              std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                        (&(iface->super_cmLinkInterface).SharedDeps,&__v_00->super_cmLinkItem);
            }
            __v_00 = __v_00 + 1;
          } while (__v_00 != pcVar4);
        }
      }
      std::
      _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
      ::~_Rb_tree(&local_88);
    }
  }
  if ((this->Target->TargetTypeValue == STATIC_LIBRARY) &&
     (pcVar7 = GetLinkImplementation(this,config), pcVar7 != (cmLinkImplementation *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(iface->super_cmLinkInterface).Languages,&pcVar7->Languages);
  }
  if (this->Target->TargetTypeValue != STATIC_LIBRARY) {
    return;
  }
  pp_Var1 = &local_88._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)CONCAT62(local_88._M_impl.super__Rb_tree_header._M_header._M_parent._2_6_,0x5f);
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl._0_8_ = pp_Var1;
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&local_88);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_a8,config);
    std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  local_58._M_dataplus._M_p = (char *)0x1b;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_58);
  local_a8.field_2._M_allocated_capacity = (size_type)local_58._M_dataplus._M_p;
  builtin_strncpy(local_a8._M_dataplus._M_p,"LINK_INTERFACE_MULTIPLICITY",0x1b);
  local_a8._M_string_length = (size_type)local_58._M_dataplus._M_p;
  local_a8._M_dataplus._M_p[(long)local_58._M_dataplus._M_p] = '\0';
  std::__cxx11::string::_M_append((char *)&local_a8,local_88._M_impl._0_8_);
  pcVar9 = GetProperty(this,&local_a8);
  if (pcVar9 == (char *)0x0) {
    local_38 = 0x1b;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
    local_58.field_2._M_allocated_capacity = local_38;
    builtin_strncpy(local_58._M_dataplus._M_p,"LINK_INTERFACE_MULTIPLICITY",0x1b);
    local_58._M_string_length = local_38;
    local_58._M_dataplus._M_p[local_38] = '\0';
    pcVar9 = GetProperty(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (pcVar9 == (char *)0x0) goto LAB_00338986;
  }
  __isoc99_sscanf(pcVar9,"%u",&(iface->super_cmLinkInterface).Multiplicity);
LAB_00338986:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  }
  if ((_Base_ptr *)local_88._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_88._M_impl._0_8_,
                    (ulong)((long)&(local_88._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterface(
  const std::string& config, cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget) const
{
  if (iface.ExplicitLibraries) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Shared libraries may have runtime implementation dependencies
      // on other shared libraries that are not in the interface.
      std::set<cmLinkItem> emitted;
      for (cmLinkItem const& lib : iface.Libraries) {
        emitted.insert(lib);
      }
      if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
        cmLinkImplementation const* impl = this->GetLinkImplementation(config);
        for (cmLinkImplItem const& lib : impl->Libraries) {
          if (emitted.insert(lib).second) {
            if (lib.Target) {
              // This is a runtime dependency on another shared library.
              if (lib.Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
                iface.SharedDeps.push_back(lib);
              }
            } else {
              // TODO: Recognize shared library file names.  Perhaps this
              // should be moved to cmComputeLinkInformation, but that creates
              // a chicken-and-egg problem since this list is needed for its
              // construction.
            }
          }
        }
      }
    }
  } else if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN ||
             this->GetPolicyStatusCMP0022() == cmPolicies::OLD) {
    // The link implementation is the default link interface.
    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibrariesInternal(config, headTarget);
    iface.ImplementationIsInterface = true;
    iface.WrongConfigLibraries = impl->WrongConfigLibraries;
  }

  if (this->LinkLanguagePropagatesToDependents()) {
    // Targets using this archive need its language runtime libraries.
    if (cmLinkImplementation const* impl =
          this->GetLinkImplementation(config)) {
      iface.Languages = impl->Languages;
    }
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    // Construct the property name suffix for this configuration.
    std::string suffix = "_";
    if (!config.empty()) {
      suffix += cmSystemTools::UpperCase(config);
    } else {
      suffix += "NOCONFIG";
    }

    // How many repetitions are needed if this library has cyclic
    // dependencies?
    std::string propName = "LINK_INTERFACE_MULTIPLICITY";
    propName += suffix;
    if (const char* config_reps = this->GetProperty(propName)) {
      sscanf(config_reps, "%u", &iface.Multiplicity);
    } else if (const char* reps =
                 this->GetProperty("LINK_INTERFACE_MULTIPLICITY")) {
      sscanf(reps, "%u", &iface.Multiplicity);
    }
  }
}